

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar2_LibEvalAssignNums(Gia_Man_t *p,int Class)

{
  int iVar1;
  int Lit;
  int iVar2;
  Dar_LibObj_t *pDVar3;
  Dar_LibDat_t *pDVar4;
  Dar_LibObj_t *pDVar5;
  Dar_LibDat_t *pDVar6;
  Dar_LibDat_t *pDVar7;
  Gia_Obj_t *p1;
  Gia_Obj_t *pGVar8;
  int local_48;
  int local_44;
  int iLit;
  int i;
  int iFanin1;
  int iFanin0;
  Dar_LibDat_t *pData1;
  Dar_LibDat_t *pData0;
  Dar_LibDat_t *pData;
  Dar_LibObj_t *pObj;
  int Class_local;
  Gia_Man_t *p_local;
  
  local_44 = 0;
  while( true ) {
    if (s_DarLib->nNodes0[Class] <= local_44) {
      return;
    }
    pDVar3 = Dar_LibObj(s_DarLib,s_DarLib->pNodes0[Class][local_44]);
    *pDVar3 = (Dar_LibObj_t)((ulong)*pDVar3 & 0xfffffffff | (ulong)(local_44 + 4) << 0x24);
    if (s_DarLib->nNodes0Max + 4 <= (int)(SUB84(*pDVar3,4) >> 4)) {
      __assert_fail("(int)pObj->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darLib.c"
                    ,0x44a,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
    }
    pDVar4 = s_DarLib->pDatas + (int)(SUB84(*pDVar3,4) >> 4);
    pDVar4->fMffc = '\0';
    (pDVar4->field_0).iGunc = -1;
    pDVar4->TravId = 0xffff;
    pDVar5 = Dar_LibObj(s_DarLib,SUB84(*pDVar3,0) & 0xffff);
    if (s_DarLib->nNodes0Max + 4 <= (int)(SUB84(*pDVar5,4) >> 4)) {
      __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darLib.c"
                    ,0x451,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
    }
    pDVar5 = Dar_LibObj(s_DarLib,SUB84(*pDVar3,2) & 0xffff);
    if (s_DarLib->nNodes0Max + 4 <= (int)(SUB84(*pDVar5,4) >> 4)) break;
    pDVar6 = s_DarLib->pDatas;
    pDVar5 = Dar_LibObj(s_DarLib,SUB84(*pDVar3,0) & 0xffff);
    pDVar6 = pDVar6 + (int)(SUB84(*pDVar5,4) >> 4);
    pDVar7 = s_DarLib->pDatas;
    pDVar5 = Dar_LibObj(s_DarLib,SUB84(*pDVar3,2) & 0xffff);
    pDVar7 = pDVar7 + (int)(SUB84(*pDVar5,4) >> 4);
    iVar1 = Abc_MaxInt(pDVar6->Level,pDVar7->Level);
    pDVar4->Level = iVar1 + 1;
    if (((pDVar6->field_0).iGunc != -1) && ((pDVar7->field_0).iGunc != -1)) {
      iVar1 = Abc_LitNotCond((pDVar6->field_0).iGunc,SUB84(*pDVar3,4) & 1);
      Lit = Abc_LitNotCond((pDVar7->field_0).iGunc,SUB84(*pDVar3,4) >> 1 & 1);
      if ((iVar1 == 0) || ((Lit == 0 || (iVar2 = Abc_LitNot(Lit), iVar1 == iVar2)))) {
        local_48 = 0;
      }
      else {
        local_48 = Lit;
        if (((iVar1 != 1) && (iVar1 != Lit)) && (local_48 = iVar1, Lit != 1)) {
          pGVar8 = Gia_ObjFromLit(p,iVar1);
          p1 = Gia_ObjFromLit(p,Lit);
          local_48 = Gia_ManHashLookup(p,pGVar8,p1);
          if (local_48 == 0) {
            local_48 = -1;
          }
        }
      }
      (pDVar4->field_0).iGunc = local_48;
      if (-1 < (pDVar4->field_0).iGunc) {
        pGVar8 = Gia_ObjFromLit(p,(pDVar4->field_0).iGunc);
        pGVar8 = Gia_Regular(pGVar8);
        iVar1 = Gia_ObjLevel(p,pGVar8);
        pDVar4->Level = iVar1;
      }
    }
    local_44 = local_44 + 1;
  }
  __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darLib.c"
                ,0x452,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
}

Assistant:

void Dar2_LibEvalAssignNums( Gia_Man_t * p, int Class )
{
    Dar_LibObj_t * pObj;
    Dar_LibDat_t * pData, * pData0, * pData1;
    int iFanin0, iFanin1, i, iLit;
    for ( i = 0; i < s_DarLib->nNodes0[Class]; i++ )
    {
        // get one class node, assign its temporary number and set its data
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pNodes0[Class][i]);
        pObj->Num = 4 + i;
        assert( (int)pObj->Num < s_DarLib->nNodes0Max + 4 );
        pData = s_DarLib->pDatas + pObj->Num;
        pData->fMffc = 0;
        pData->iGunc = -1;
        pData->TravId = 0xFFFF;

        // explore the fanins
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4 );
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4 );
        pData0 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan0)->Num;
        pData1 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan1)->Num;
        pData->Level = 1 + Abc_MaxInt(pData0->Level, pData1->Level);
        if ( pData0->iGunc == -1 || pData1->iGunc == -1 )
            continue;
        iFanin0 = Abc_LitNotCond( pData0->iGunc, pObj->fCompl0 );
        iFanin1 = Abc_LitNotCond( pData1->iGunc, pObj->fCompl1 );
        // compute the resulting literal
        if ( iFanin0 == 0 || iFanin1 == 0 || iFanin0 == Abc_LitNot(iFanin1) )
            iLit = 0;
        else if ( iFanin0 == 1 || iFanin0 == iFanin1 )
            iLit = iFanin1;
        else if ( iFanin1 == 1 )
            iLit = iFanin0;
        else
        {
            iLit = Gia_ManHashLookup( p, Gia_ObjFromLit(p, iFanin0), Gia_ObjFromLit(p, iFanin1) );
            if ( iLit == 0 )
                iLit = -1;
        }
        pData->iGunc = iLit;
        if ( pData->iGunc >= 0 )
        {
            // update the level to be more accurate
            pData->Level = Gia_ObjLevel( p, Gia_Regular(Gia_ObjFromLit(p, pData->iGunc)) );
            // mark the node if it is part of MFFC
//            pData->fMffc = Gia_ObjIsTravIdCurrentArray(p, Gia_Regular(pData->pGunc));
        }
    }
}